

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<tcu::Interval,_4,_3> * __thiscall
tcu::Matrix<tcu::Interval,_4,_3>::operator=
          (Matrix<tcu::Interval,_4,_3> *this,Matrix<tcu::Interval,_4,_3> *src)

{
  undefined7 uVar1;
  Interval *pIVar2;
  Interval *pIVar3;
  int local_20;
  int local_1c;
  int col;
  int row;
  Matrix<tcu::Interval,_4,_3> *src_local;
  Matrix<tcu::Interval,_4,_3> *this_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pIVar2 = operator()(src,local_1c,local_20);
      pIVar3 = operator()(this,local_1c,local_20);
      uVar1 = *(undefined7 *)&pIVar2->field_0x1;
      pIVar3->m_hasNaN = pIVar2->m_hasNaN;
      *(undefined7 *)&pIVar3->field_0x1 = uVar1;
      pIVar3->m_lo = pIVar2->m_lo;
      pIVar3->m_hi = pIVar2->m_hi;
    }
  }
  return this;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}